

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# new.cc
# Opt level: O0

void operator_delete(void *p,align_val_t param_2)

{
  code *pcVar1;
  bool bVar2;
  MetaEntryBase *this;
  conditional_t<Config::Options_IsQueueInline,_RemoteAllocator,_RemoteAllocator_*> *pcVar3;
  Alloc<void> p_00;
  size_t sVar4;
  alloc_id_t target_id;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *this_00;
  BackendSlabMetadata *in_RSI;
  sizeclass_t in_RDI;
  undefined8 *in_FS_OFFSET;
  PagemapEntry *entry;
  CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
  p_tame;
  AllocWild<void> p_wild;
  CapPtr<snmalloc::freelist::Object::T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
  cp;
  SlabMetadata *meta;
  bool result;
  int64_t size;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  r;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *entry_1;
  address_t in_stack_fffffffffffffb58;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *in_stack_fffffffffffffb60;
  LocalEntropy *in_stack_fffffffffffffb70;
  address_t in_stack_fffffffffffffb78;
  Alloc<RemoteMessage> msg;
  FreeListKey *in_stack_fffffffffffffb80;
  sizeclass_t sizeclass;
  BHeadPtr<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  n;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *this_01;
  Alloc<void> p_01;
  Alloc<void> p_02;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_420;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_418;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_408;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> **local_400;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_3f0;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_3e8;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_3e0;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_3d8;
  size_t local_3d0;
  ulong local_3c8;
  MetaEntryBase *local_3c0;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_3b8;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_3b0;
  char *local_3a8;
  undefined1 local_399;
  char **local_398;
  MetaEntryBase *local_390;
  MetaEntryBase *local_388;
  ulong local_380;
  ulong local_378;
  MetaEntryBase *local_370;
  ulong local_368;
  MetaEntryBase *local_360;
  size_t local_358;
  MetaEntryBase *local_350;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_348;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> **local_340;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_338;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_330;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> **local_328;
  ulong local_318;
  ulong local_310;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> **local_300;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_2f8;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_2f0;
  undefined1 local_2e8 [8];
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_2e0;
  undefined1 *local_2d8;
  LocalState *local_2c0;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_2b8;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_2b0;
  LocalState **local_2a8;
  undefined1 local_298 [16];
  undefined1 *local_288;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_280;
  undefined8 local_278;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_270;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_268;
  MetaEntryBase *local_260;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_258;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_250;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> **local_248;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> **local_240;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> **local_238;
  char *local_230;
  byte local_221;
  char **local_220;
  undefined8 *local_218;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> **local_210;
  undefined8 local_208;
  undefined8 *local_200;
  MetaEntryBase *local_1f8;
  undefined1 local_1e9;
  size_t local_1e8;
  long local_1e0;
  undefined2 local_1d2;
  MetaEntryBase *local_1d0;
  RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
  *local_1c8;
  ulong local_1c0;
  MetaEntryBase *local_1b8;
  size_t local_1b0;
  MetaEntryBase *local_1a8;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_1a0;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_198 [2];
  undefined1 local_188 [16];
  undefined1 *local_178;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> **local_170;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> **local_168;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> **local_160;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> **local_158;
  MetaEntryBase *local_150;
  MetaEntryBase *local_148;
  ulong local_140;
  MetaEntryBase *local_138;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *local_130;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_128;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_120;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_118;
  long local_110;
  ulong local_108;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *local_100;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_f8;
  Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *local_f0;
  char *local_e8;
  undefined1 local_d9;
  char **local_d8;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_d0;
  SingletonRemoteMessage *local_c8;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_c0;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *local_b8
  ;
  long local_b0;
  ulong local_a8;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *local_a0;
  FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
  *local_98;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_90;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_88;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  **local_80;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_78;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  **local_70;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_68;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  **local_60;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_58;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_50;
  undefined1 local_48 [8];
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_40;
  undefined1 *local_38;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_30;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *local_28
  ;
  ulong local_20;
  DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_> *local_18
  ;
  T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
  *local_10;
  long *local_8;
  
  sizeclass.value = *(undefined8 *)*in_FS_OFFSET;
  local_178 = local_188;
  this_01 = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
            in_RDI.value;
  p_01.unsafe_capptr = (void *)in_RDI.value;
  local_418 = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
              in_RDI.value;
  local_408 = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
              sizeclass.value;
  local_2c0 = snmalloc::
              Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
              backend_state_ptr((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                                 *)sizeclass.value);
  local_2b8 = local_418;
  local_2a8 = &local_2c0;
  local_170 = &local_2b8;
  local_288 = local_298;
  local_2b0 = local_418;
  local_420 = local_418;
  local_330 = local_418;
  local_328 = &local_330;
  this = (MetaEntryBase *)
         snmalloc::
         FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
         ::get<false>(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  pcVar3 = snmalloc::
           Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
           public_state((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                         *)sizeclass.value);
  local_378 = this->remote_and_sizeclass;
  local_390 = this;
  local_370 = this;
  if (pcVar3 == (conditional_t<Config::Options_IsQueueInline,_RemoteAllocator,_RemoteAllocator_*> *)
                (local_378 & 0xffffffffffffff80)) {
    local_400 = &local_420;
    local_280 = local_420;
    local_158 = &local_280;
    local_3b0 = local_420;
    local_3c8 = this->meta & 0xfffffffffffffffe;
    n.unsafe_capptr =
         (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
          *)sizeclass.value;
    local_3c0 = this;
    local_3b8 = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                 *)sizeclass.value;
    local_388 = this;
    local_368 = local_3c8;
    local_360 = this;
    local_350 = this;
    local_3d0 = (size_t)snmalloc::sizeclass_t::from_raw(in_stack_fffffffffffffb58);
    local_3d8 = local_3b0;
    local_348 = local_3b0;
    local_340 = &local_348;
    local_338 = local_3b0;
    local_358 = local_3d0;
    local_399 = snmalloc::is_start_of_object(in_RDI,(address_t)in_RSI);
    local_3a8 = "Not deallocating start of an object";
    if (((local_399 ^ 0xff) & 1) != 0) {
      local_398 = &local_3a8;
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    local_300 = &local_3b0;
    local_2f0 = local_3b0;
    local_2d8 = local_2e8;
    local_2f8 = local_3b0;
    local_3e0 = local_3b0;
    local_3e8 = local_3b0;
    local_380 = local_3c8;
    local_310 = local_3c8;
    local_318 = local_3c8;
    local_2e0 = local_2f0;
    snmalloc::freelist::
    Builder<true,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
    ::add((Builder<true,_true,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
           *)sizeclass.value,n,in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,
          in_stack_fffffffffffffb70);
    bVar2 = snmalloc::
            FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
            ::return_object((FrontendSlabMetadata<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>,_snmalloc::NoClientMetaDataProvider>
                             *)0x148503);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      local_3f0 = local_3b0;
      snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::
      dealloc_local_object_slow(this_01,p_01,(PagemapEntry *)in_RDI.value,in_RSI);
    }
  }
  else {
    local_250 = local_420;
    local_140 = this->remote_and_sizeclass;
    local_260 = this;
    local_258 = (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                 *)sizeclass.value;
    local_150 = this;
    local_148 = this;
    local_138 = this;
    if ((local_140 & 0xffffffffffffff80) == 0) {
      local_200 = &local_278;
      local_208 = 0;
      local_278 = 0;
      local_210 = &local_250;
      local_218 = &local_278;
      if (local_420 !=
          (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)0x0)
      {
        local_240 = &local_250;
        local_1a0 = local_420;
        local_160 = &local_1a0;
        local_248 = &local_250;
        local_f0 = local_420;
        local_d9 = local_420 ==
                   (Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                    *)0x0;
        local_e8 = "Not allocated by snmalloc.";
        if (!(bool)local_d9) {
          local_d8 = &local_e8;
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
      }
    }
    else {
      local_238 = &local_250;
      local_198[0] = local_420;
      local_168 = local_198;
      p_02.unsafe_capptr = local_420;
      bVar2 = snmalloc::MetaEntryBase::is_backend_owned(this);
      local_221 = (bVar2 ^ 0xffU) & 1;
      local_230 = "Memory corruption detected";
      if (((local_221 ^ 0xff) & 1) != 0) {
        local_220 = &local_230;
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      msg.unsafe_capptr =
           (SingletonRemoteMessage *)
           &((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_> *)
            sizeclass.value)->remote_dealloc_cache;
      local_1d0 = local_260;
      local_1d2 = 1;
      p_00.unsafe_capptr = (void *)0x1;
      local_1b8 = local_260;
      local_1a8 = local_260;
      local_1c8 = (RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                   *)msg.unsafe_capptr;
      local_1e8 = (size_t)snmalloc::sizeclass_t::from_raw(in_stack_fffffffffffffb58);
      local_1b0 = local_1e8;
      sVar4 = snmalloc::sizeclass_full_to_size(sizeclass);
      local_1e0 = (long)p_00.unsafe_capptr * sVar4;
      local_1e9 = local_1e0 <
                  ((RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                    *)msg.unsafe_capptr)->capacity;
      if ((bool)local_1e9) {
        ((RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
          *)msg.unsafe_capptr)->capacity =
             ((RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
               *)msg.unsafe_capptr)->capacity - local_1e0;
        this_00 = (FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
                   *)(sizeclass.value + 0x420);
        local_1f8 = local_260;
        local_1c0 = local_260->meta & 0xfffffffffffffffe;
        local_268 = local_250;
        local_110 = sizeclass.value + 0x2048;
        local_f8 = local_250;
        local_120 = local_250;
        local_108 = local_1c0;
        local_100 = this_00;
        local_128 = (T<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>_>
                     *)snmalloc::freelist::Object::
                       make<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)0>,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
                                 ((CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)0,_(snmalloc::capptr::dimension::AddressSpaceControl)0,_(snmalloc::capptr::dimension::Wildness)1>_>
                                   )p_00.unsafe_capptr);
        local_a0 = this_00 + 0xc0;
        local_a8 = local_108;
        local_b0 = local_110;
        local_8 = &local_b0;
        local_80 = &local_88;
        local_130 = this_00;
        local_118 = local_128;
        local_c0 = local_128;
        local_98 = this_00;
        local_90 = local_128;
        local_88 = local_128;
        local_78 = local_128;
        local_30 = local_128;
        local_10 = local_128;
        local_b8 = snmalloc::
                   FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>
                   ::get<false>(this_00,in_stack_fffffffffffffb58);
        local_20 = (local_b8->
                   super_FrontendMetaEntry<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>
                   ).super_MetaEntryBase.remote_and_sizeclass;
        local_28 = local_b8;
        local_18 = local_b8;
        target_id = snmalloc::RemoteAllocator::trunc_id
                              ((RemoteAllocator *)(local_20 & 0xffffffffffffff80));
        local_70 = &local_90;
        local_50 = local_90;
        local_38 = local_48;
        local_58 = local_90;
        local_68 = local_90;
        local_d0 = local_90;
        local_60 = local_70;
        local_40 = local_50;
        local_c8 = (SingletonRemoteMessage *)
                   snmalloc::SingletonRemoteMessage::emplace_in_alloc(p_00);
        snmalloc::
        RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
        ::dealloc<11008UL>::anon_class_8_1_8991fb9c::operator()
                  ((anon_class_8_1_8991fb9c *)p_00.unsafe_capptr,target_id,msg);
      }
      else {
        local_270 = local_250;
        snmalloc::Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
        ::dealloc_remote_slow<snmalloc::CheckInitPthread>
                  ((Allocator<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
                    *)p_01.unsafe_capptr,(PagemapEntry *)this_01,p_02);
      }
    }
  }
  return;
}

Assistant:

void operator delete(void* p, std::align_val_t) EXCEPTSPEC
{
  snmalloc::libc::free(p);
}